

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O1

void __thiscall
kj::_::anon_unknown_0::ThrowingDestructor::~ThrowingDestructor(ThrowingDestructor *this)

{
  bool bVar1;
  RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_test_c__:100:32)>
  runnable;
  Runnable local_18 [2];
  
  bVar1 = UnwindDetector::isUnwinding(&this->super_UnwindDetector);
  if (bVar1) {
    local_18[0]._vptr_Runnable = (_func_int **)&PTR_run_001c12c0;
    UnwindDetector::catchExceptionsAsSecondaryFaults(&this->super_UnwindDetector,local_18);
    return;
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
            ((Fault *)local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++"
             ,0x65,FAILED,(char *)0x0,"\"this is a test, not a real bug\"",
             (char (*) [31])"this is a test, not a real bug");
  Debug::Fault::fatal((Fault *)local_18);
}

Assistant:

~ThrowingDestructor() noexcept(false) {
    catchExceptionsIfUnwinding([]() {
      KJ_FAIL_ASSERT("this is a test, not a real bug");
    });
  }